

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O1

void PrintBlock(InstructionVMGraphContext *ctx,VmBlock *block)

{
  VmInstructionType VVar1;
  VmBlock *pVVar2;
  ulong uVar3;
  char *pcVar4;
  VmValue *pVVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  VmInstruction *pVVar9;
  
  PrintUsers(ctx,&block->super_VmValue,false);
  pcVar4 = (block->name).begin;
  PrintLine(ctx,"%.*s.b%d:",(ulong)(uint)(*(int *)&(block->name).end - (int)pcVar4),pcVar4,
            (ulong)block->uniqueId);
  ctx->depth = ctx->depth + 1;
  Print(ctx,"  // predecessor blocks: [");
  if ((block->predecessors).count != 0) {
    uVar7 = 0;
    do {
      pVVar2 = (block->predecessors).data[uVar7];
      if (uVar7 != 0) {
        Print(ctx,", ");
      }
      pcVar4 = (pVVar2->name).begin;
      Print(ctx,"\'%.*s.b%d\'",(ulong)(uint)(*(int *)&(pVVar2->name).end - (int)pcVar4),pcVar4,
            (ulong)pVVar2->uniqueId);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (block->predecessors).count);
  }
  PrintLine(ctx,"]");
  Print(ctx,"  // successor blocks: [");
  if ((block->successors).count != 0) {
    uVar7 = 0;
    do {
      pVVar2 = (block->successors).data[uVar7];
      if (uVar7 != 0) {
        Print(ctx,", ");
      }
      pcVar4 = (pVVar2->name).begin;
      Print(ctx,"\'%.*s.b%d\'",(ulong)(uint)(*(int *)&(pVVar2->name).end - (int)pcVar4),pcVar4,
            (ulong)pVVar2->uniqueId);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (block->successors).count);
  }
  PrintLine(ctx,"]");
  Print(ctx,"  // immediate dominator: [");
  pVVar2 = block->idom;
  if (pVVar2 != (VmBlock *)0x0) {
    pcVar4 = (pVVar2->name).begin;
    Print(ctx,"\'%.*s.b%d\'",(ulong)(uint)(*(int *)&(pVVar2->name).end - (int)pcVar4),pcVar4,
          (ulong)pVVar2->uniqueId);
  }
  PrintLine(ctx,"]");
  Print(ctx,"  // dominance frontier: [");
  if ((block->dominanceFrontier).count != 0) {
    uVar7 = 0;
    do {
      pVVar2 = (block->dominanceFrontier).data[uVar7];
      if (uVar7 != 0) {
        Print(ctx,", ");
      }
      pcVar4 = (pVVar2->name).begin;
      Print(ctx,"\'%.*s.b%d\'",(ulong)(uint)(*(int *)&(pVVar2->name).end - (int)pcVar4),pcVar4,
            (ulong)pVVar2->uniqueId);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (block->dominanceFrontier).count);
  }
  PrintLine(ctx,"]");
  Print(ctx,"  // dominance children: [");
  if ((block->dominanceChildren).count != 0) {
    uVar7 = 0;
    do {
      pVVar2 = (block->dominanceChildren).data[uVar7];
      if (uVar7 != 0) {
        Print(ctx,", ");
      }
      pcVar4 = (pVVar2->name).begin;
      Print(ctx,"\'%.*s.b%d\'",(ulong)(uint)(*(int *)&(pVVar2->name).end - (int)pcVar4),pcVar4,
            (ulong)pVVar2->uniqueId);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (block->dominanceChildren).count);
  }
  PrintLine(ctx,"]");
  Print(ctx,"  // live variables going in: [");
  if ((block->liveIn).count != 0) {
    uVar7 = 0;
    do {
      pVVar9 = (block->liveIn).data[uVar7];
      if (uVar7 != 0) {
        Print(ctx,", ");
      }
      VVar1 = pVVar9->cmd;
      Print(ctx,"%%%d",(ulong)pVVar9->uniqueId);
      if (VVar1 == VM_INST_PHI) {
        if (pVVar9->color != 0) {
          Print(ctx,".c%d");
        }
        if ((pVVar9->regVmRegisters).count != 0) {
          Print(ctx,".r");
          if ((pVVar9->regVmRegisters).count != 0) {
            uVar8 = 0;
            do {
              pcVar4 = "|%d";
              if (uVar8 == 0) {
                pcVar4 = "%d";
              }
              Print(ctx,pcVar4,(ulong)(pVVar9->regVmRegisters).data[uVar8]);
              uVar8 = uVar8 + 1;
            } while (uVar8 < (pVVar9->regVmRegisters).count);
          }
        }
        pcVar4 = (pVVar9->super_VmValue).comment.begin;
        if (pcVar4 == (pVVar9->super_VmValue).comment.end) {
          Print(ctx," [");
        }
        else {
          Print(ctx," (%.*s) [",
                (ulong)(uint)(*(int *)&(pVVar9->super_VmValue).comment.end - (int)pcVar4));
        }
        if ((pVVar9->arguments).count != 0) {
          uVar8 = 0;
          do {
            pVVar5 = (pVVar9->arguments).data[uVar8];
            if ((pVVar5 == (VmValue *)0x0) || (pVVar5->typeID != 2)) {
              pVVar5 = (VmValue *)0x0;
            }
            if ((int)uVar8 != 0) {
              Print(ctx,", ");
            }
            pcVar4 = (pVVar5->comment).begin;
            uVar3 = (ulong)*(uint *)((long)&pVVar5[1]._vptr_VmValue + 4);
            if (pcVar4 == (pVVar5->comment).end) {
              Print(ctx,"%%%d",uVar3);
            }
            else {
              Print(ctx,"%%%d (%.*s)",uVar3,
                    (ulong)(uint)(*(int *)&(pVVar5->comment).end - (int)pcVar4));
            }
            uVar6 = (int)uVar8 + 2;
            uVar8 = (ulong)uVar6;
          } while (uVar6 < (pVVar9->arguments).count);
        }
        Print(ctx,"]");
      }
      else {
        if (pVVar9->color != 0) {
          Print(ctx,".c%d");
        }
        if ((pVVar9->regVmRegisters).count != 0) {
          Print(ctx,".r");
          if ((pVVar9->regVmRegisters).count != 0) {
            uVar8 = 0;
            do {
              pcVar4 = "|%d";
              if (uVar8 == 0) {
                pcVar4 = "%d";
              }
              Print(ctx,pcVar4,(ulong)(pVVar9->regVmRegisters).data[uVar8]);
              uVar8 = uVar8 + 1;
            } while (uVar8 < (pVVar9->regVmRegisters).count);
          }
        }
        pcVar4 = (pVVar9->super_VmValue).comment.begin;
        if (pcVar4 != (pVVar9->super_VmValue).comment.end) {
          Print(ctx," (%.*s)",
                (ulong)(uint)(*(int *)&(pVVar9->super_VmValue).comment.end - (int)pcVar4));
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (block->liveIn).count);
  }
  PrintLine(ctx,"]");
  Print(ctx,"  // live variables going out: [");
  if ((block->liveOut).count != 0) {
    uVar7 = 0;
    do {
      pVVar9 = (block->liveOut).data[uVar7];
      if (uVar7 != 0) {
        Print(ctx,", ");
      }
      Print(ctx,"%%%d",(ulong)pVVar9->uniqueId);
      if (pVVar9->color != 0) {
        Print(ctx,".c%d");
      }
      if ((pVVar9->regVmRegisters).count != 0) {
        Print(ctx,".r");
        if ((pVVar9->regVmRegisters).count != 0) {
          uVar8 = 0;
          do {
            pcVar4 = "|%d";
            if (uVar8 == 0) {
              pcVar4 = "%d";
            }
            Print(ctx,pcVar4,(ulong)(pVVar9->regVmRegisters).data[uVar8]);
            uVar8 = uVar8 + 1;
          } while (uVar8 < (pVVar9->regVmRegisters).count);
        }
      }
      pcVar4 = (pVVar9->super_VmValue).comment.begin;
      if (pcVar4 != (pVVar9->super_VmValue).comment.end) {
        Print(ctx," (%.*s)",
              (ulong)(uint)(*(int *)&(pVVar9->super_VmValue).comment.end - (int)pcVar4));
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (block->liveOut).count);
  }
  PrintLine(ctx,"]");
  for (pVVar9 = block->firstInstruction; pVVar9 != (VmInstruction *)0x0;
      pVVar9 = pVVar9->nextSibling) {
    if ((ctx->displayAsTree != true) || ((pVVar9->super_VmValue).users.count == 0)) {
      PrintIndent(ctx);
      PrintInstruction(ctx,pVVar9);
    }
  }
  ctx->depth = ctx->depth - 1;
  OutputContext::Print(ctx->output,"\n",1);
  return;
}

Assistant:

void PrintBlock(InstructionVMGraphContext &ctx, VmBlock *block)
{
	PrintUsers(ctx, block, false);

	PrintLine(ctx, "%.*s.b%d:", FMT_ISTR(block->name), block->uniqueId);

	ctx.depth++;

	Print(ctx, "  // predecessor blocks: [");

	for(unsigned i = 0; i < block->predecessors.size(); i++)
	{
		VmBlock *predecessor = block->predecessors[i];

		if(i != 0)
			Print(ctx, ", ");

		Print(ctx, "'%.*s.b%d'", FMT_ISTR(predecessor->name), predecessor->uniqueId);
	}

	PrintLine(ctx, "]");

	Print(ctx, "  // successor blocks: [");

	for(unsigned i = 0; i < block->successors.size(); i++)
	{
		VmBlock *successor = block->successors[i];

		if(i != 0)
			Print(ctx, ", ");

		Print(ctx, "'%.*s.b%d'", FMT_ISTR(successor->name), successor->uniqueId);
	}

	PrintLine(ctx, "]");

	Print(ctx, "  // immediate dominator: [");

	if(block->idom)
		Print(ctx, "'%.*s.b%d'", FMT_ISTR(block->idom->name), block->idom->uniqueId);

	PrintLine(ctx, "]");

	Print(ctx, "  // dominance frontier: [");

	for(unsigned i = 0; i < block->dominanceFrontier.size(); i++)
	{
		VmBlock *dominator = block->dominanceFrontier[i];

		if(i != 0)
			Print(ctx, ", ");

		Print(ctx, "'%.*s.b%d'", FMT_ISTR(dominator->name), dominator->uniqueId);
	}

	PrintLine(ctx, "]");

	Print(ctx, "  // dominance children: [");

	for(unsigned i = 0; i < block->dominanceChildren.size(); i++)
	{
		VmBlock *dominator = block->dominanceChildren[i];

		if(i != 0)
			Print(ctx, ", ");

		Print(ctx, "'%.*s.b%d'", FMT_ISTR(dominator->name), dominator->uniqueId);
	}

	PrintLine(ctx, "]");

	Print(ctx, "  // live variables going in: [");

	for(unsigned i = 0; i < block->liveIn.size(); i++)
	{
		VmInstruction *liveIn = block->liveIn[i];

		if(i != 0)
			Print(ctx, ", ");

		if(liveIn->cmd == VM_INST_PHI)
		{
			Print(ctx, "%%%d", liveIn->uniqueId);

			if(liveIn->color)
				Print(ctx, ".c%d", liveIn->color);

			if(!liveIn->regVmRegisters.empty())
			{
				Print(ctx, ".r");

				for(unsigned i = 0; i < liveIn->regVmRegisters.size(); i++)
					Print(ctx, i == 0 ? "%d" : "|%d", liveIn->regVmRegisters[i]);
			}

			if(liveIn->comment.empty())
				Print(ctx, " [");
			else
				Print(ctx, " (%.*s) [", FMT_ISTR(liveIn->comment));

			for(unsigned k = 0; k < liveIn->arguments.size(); k += 2)
			{
				VmInstruction *value = getType<VmInstruction>(liveIn->arguments[k]);

				if(k != 0)
					Print(ctx, ", ");

				if(value->comment.empty())
					Print(ctx, "%%%d", value->uniqueId);
				else
					Print(ctx, "%%%d (%.*s)", value->uniqueId, FMT_ISTR(value->comment));
			}

			Print(ctx, "]");
		}
		else
		{
			Print(ctx, "%%%d", liveIn->uniqueId);

			if(liveIn->color)
				Print(ctx, ".c%d", liveIn->color);

			if(!liveIn->regVmRegisters.empty())
			{
				Print(ctx, ".r");

				for(unsigned i = 0; i < liveIn->regVmRegisters.size(); i++)
					Print(ctx, i == 0 ? "%d" : "|%d", liveIn->regVmRegisters[i]);
			}

			if(!liveIn->comment.empty())
				Print(ctx, " (%.*s)", FMT_ISTR(liveIn->comment));
		}
	}

	PrintLine(ctx, "]");

	Print(ctx, "  // live variables going out: [");

	for(unsigned i = 0; i < block->liveOut.size(); i++)
	{
		VmInstruction *liveOut = block->liveOut[i];

		if(i != 0)
			Print(ctx, ", ");

		Print(ctx, "%%%d", liveOut->uniqueId);

		if(liveOut->color)
			Print(ctx, ".c%d", liveOut->color);

		if(!liveOut->regVmRegisters.empty())
		{
			Print(ctx, ".r");

			for(unsigned i = 0; i < liveOut->regVmRegisters.size(); i++)
				Print(ctx, i == 0 ? "%d" : "|%d", liveOut->regVmRegisters[i]);
		}

		if(!liveOut->comment.empty())
			Print(ctx, " (%.*s)", FMT_ISTR(liveOut->comment));
	}

	PrintLine(ctx, "]");

	for(VmInstruction *value = block->firstInstruction; value; value = value->nextSibling)
	{
		if(ctx.displayAsTree && !value->users.empty())
			continue;

		PrintIndent(ctx);
		PrintInstruction(ctx, value);
	}

	ctx.depth--;

	PrintLine(ctx);
}